

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O1

ssize_t __thiscall
Dashel::UDPSocketStream::send(UDPSocketStream *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ushort uVar1;
  uint uVar2;
  _func_int *p_Var3;
  ssize_t sVar4;
  ssize_t extraout_RAX;
  int *piVar5;
  undefined4 in_register_00000034;
  sockaddr_in addr;
  sockaddr local_18;
  
  local_18.sa_family = 2;
  uVar1 = (ushort)((uint *)CONCAT44(in_register_00000034,__fd))[1];
  local_18.sa_data._0_2_ = uVar1 << 8 | uVar1 >> 8;
  uVar2 = *(uint *)CONCAT44(in_register_00000034,__fd);
  local_18.sa_data._2_4_ =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  sVar4 = sendto(*(int *)&(this->super_MemoryPacketStream).super_PacketStream.field_0x78,
                 *(void **)&(this->super_MemoryPacketStream).super_PacketStream.field_0x8,
                 *(size_t *)&(this->super_MemoryPacketStream).super_PacketStream.field_0x18,0,
                 &local_18,0x10);
  if ((-1 < sVar4) &&
     (sVar4 == *(long *)&(this->super_MemoryPacketStream).super_PacketStream.field_0x18)) {
    ExpandableBuffer::clear
              ((ExpandableBuffer *)&(this->super_MemoryPacketStream).super_PacketStream.field_0x8);
    return extraout_RAX;
  }
  p_Var3 = (this->super_MemoryPacketStream).super_PacketStream._vptr_PacketStream[-3];
  piVar5 = __errno_location();
  Stream::fail((Stream *)
               ((long)&(this->super_MemoryPacketStream).super_PacketStream._vptr_PacketStream +
               (long)p_Var3),IOError,*piVar5,"UDP Socket write I/O error.");
}

Assistant:

virtual void send(const IPV4Address& dest)
		{
			sockaddr_in addr;
			addr.sin_family = AF_INET;
			addr.sin_port = htons(dest.port);
			addr.sin_addr.s_addr = htonl(dest.address);

			ssize_t sent = sendto(fd, sendBuffer.get(), sendBuffer.size(), 0, (struct sockaddr*)&addr, sizeof(addr));
			if (sent < 0 || static_cast<size_t>(sent) != sendBuffer.size())
				fail(DashelException::IOError, errno, "UDP Socket write I/O error.");

			sendBuffer.clear();
		}